

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall cs::instance_type::parse_using(instance_type *this,iterator it,bool override)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  char *__s1;
  element_type *peVar3;
  int iVar4;
  token_base **pptVar5;
  undefined4 extraout_var;
  undefined *puVar6;
  shared_ptr<cs::name_space> *psVar7;
  runtime_error *this_00;
  size_t sVar8;
  _func_int **pp_Var9;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var10;
  var ns;
  undefined1 local_60 [16];
  string local_50;
  
  local_60._8_8_ = it.mData;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)(local_60 + 8));
  iVar4 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar4 == 0xf) {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)(local_60 + 8));
    ptVar1 = *pptVar5;
    pp_Var10 = ptVar1[2]._vptr_token_base;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    if (pp_Var10 != pp_Var2) {
      pp_Var9 = ptVar1[3]._vptr_token_base;
      sVar8 = ptVar1[3].line_num;
      do {
        parse_using(this,(tree_node *)*pp_Var10,false);
        pp_Var10 = pp_Var10 + 1;
        if (pp_Var10 == pp_Var9) {
          pp_Var10 = *(_func_int ***)(sVar8 + 8);
          sVar8 = sVar8 + 8;
          pp_Var9 = pp_Var10 + 0x40;
        }
      } while (pp_Var10 != pp_Var2);
    }
  }
  else {
    runtime_type::parse_expr
              ((runtime_type *)local_60,
               (iterator *)
               (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(bool)((char)local_60 + '\b'));
    if ((proxy *)local_60._0_8_ == (proxy *)0x0) {
      puVar6 = &void::typeinfo;
    }
    else {
      iVar4 = (*(*(baseHolder **)(local_60._0_8_ + 0x10))->_vptr_baseHolder[2])();
      puVar6 = (undefined *)CONCAT44(extraout_var,iVar4);
    }
    __s1 = *(char **)(puVar6 + 8);
    if ((__s1 != "St10shared_ptrIN2cs10name_spaceEE") &&
       ((*__s1 == '*' || (iVar4 = strcmp(__s1,"St10shared_ptrIN2cs10name_spaceEE"), iVar4 != 0)))) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_60 + 0x10),"Only support involve namespace.","");
      runtime_error::runtime_error(this_00,(string *)(local_60 + 0x10));
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    peVar3 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    psVar7 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>((any *)local_60);
    domain_manager::involve_domain
              (&(peVar3->super_runtime_type).storage,
               ((psVar7->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_data,override);
    cs_impl::any::recycle((any *)local_60);
  }
  return;
}

Assistant:

void instance_type::parse_using(tree_type<token_base *>::iterator it, bool override)
	{
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				parse_using(t.root());
		}
		else {
			var ns = context->instance->parse_expr(it, true);
			if (ns.type() == typeid(namespace_t))
				context->instance->storage.involve_domain(ns.const_val<namespace_t>()->get_domain(), override);
			else
				throw runtime_error("Only support involve namespace.");
		}
	}